

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimatedplane.cc
# Opt level: O0

void __thiscall gmath::EstimatedPlane::computePlane(EstimatedPlane *this)

{
  double dVar1;
  double div;
  EstimatedPlane *this_local;
  
  if (2 < this->n) {
    dVar1 = -((double)this->n * this->sxy) * this->sxy +
            -(this->sxx * this->sy) * this->sy +
            -(this->syy * this->sx) * this->sx +
            (double)this->n * this->sxx * this->syy + this->sx * 2.0 * this->sy * this->sxy;
    if ((ABS(dVar1) != 0.0) || (NAN(ABS(dVar1)))) {
      this->a = (this->sz * (this->sxy * this->sy + -(this->sx * this->syy)) +
                this->sxz * ((double)this->n * this->syy + -(this->sy * this->sy)) +
                this->syz * (this->sx * this->sy + -((double)this->n * this->sxy))) / dVar1;
      this->b = (this->sz * (this->sx * this->sxy + -(this->sxx * this->sy)) +
                this->sxz * (this->sx * this->sy + -((double)this->n * this->sxy)) +
                this->syz * ((double)this->n * this->sxx + -(this->sx * this->sx))) / dVar1;
      this->c = (this->sz * (this->sxx * this->syy + -(this->sxy * this->sxy)) +
                this->sxz * (this->sxy * this->sy + -(this->sx * this->syy)) +
                this->syz * (this->sx * this->sxy + -(this->sxx * this->sy))) / dVar1;
    }
  }
  return;
}

Assistant:

void EstimatedPlane::computePlane()
{
  if (n >= 3)
  {
    double div=n*sxx*syy+2*sx*sy*sxy-syy*sx*sx-sxx*sy*sy-n*sxy*sxy;

    if (fabs(div) != 0)
    {
      a=(sxz*(n*syy-sy*sy)+syz*(sx*sy-n*sxy)+sz*(sxy*sy-sx*syy))/div;
      b=(sxz*(sx*sy-n*sxy)+syz*(n*sxx-sx*sx)+sz*(sx*sxy-sxx*sy))/div;
      c=(sxz*(sxy*sy-sx*syy)+syz*(sx*sxy-sxx*sy)+sz*(sxx*syy-sxy*sxy))/div;
    }
  }
}